

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdpp.cxx
# Opt level: O1

bool __thiscall GD::Image::CreateFrom(Image *this,FILE *in)

{
  bool bVar1;
  int __c;
  
  __c = fgetc((FILE *)in);
  ungetc(__c,(FILE *)in);
  if (__c < 0x47) {
    if (__c == 0) {
      bVar1 = CreateFromWBMP(this,in);
      return bVar1;
    }
    if (__c == 0x23) {
      bVar1 = CreateFromXbm(this,in);
      return bVar1;
    }
  }
  else {
    if (__c == 0x67) {
      bVar1 = CreateFromGd2(this,in);
      return bVar1;
    }
    if (__c == 0x47) {
      bVar1 = CreateFromGif(this,in);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Image::CreateFrom(FILE * in)
		{
		bool rtn;
		int c = fgetc(in);
		ungetc(c, in);
		switch (c)
			{
		/* PNG
		The first eight bytes of a PNG file always contain the following (decimal) values:
		   0x89 0x50 0x4E 0x47 0x0D 0x0A 0x1A 0x0A
		   == .PNG\r\n.\n
		*/
#ifdef HAVE_LIBPNG
		case 0x89: // PNG
			rtn = CreateFromPng(in);
			break;
#endif
		/* GIF
			0x47 0x49 0x46
		*/
		case 0x47: // GIF
			rtn = CreateFromGif(in);
			break;
#ifdef HAVE_LIBJPEG
		/* JPEG
		A JFIF-standard file will start with the four bytes (hex) FF D8 FF E0,
		    followed by two variable bytes (often hex 00 10), followed by 'JFIF'.		
		*/
		case 0xFF: // JPEG
			rtn = CreateFromJpeg(in);
			break;
#endif
		/* WBMP
		WBMP Type 0: B/W, Uncompressed bitmap is the only gd supported type		
		*/
		case 0x00: // WBMP
			rtn = CreateFromWBMP(in);
			break;
		/* GD2
			0x67 0x64 0x32 0x00 
			== GD2\0
		Starts with gd2 
		*/
		case 0x67: // GD2
			rtn = CreateFromGd2(in);
			break;
		/* GD
			0xFF 0xFE
			or 
			0xFF 0xFF 
			Conflicts with Jpeg
		*/
		/* XBM
			#define test_width 16
			#define test_height 7
		*/	
		case 0x23: // XBM
			rtn = CreateFromXbm(in);
			break;
		default:
			rtn = false;
			break;
			}
		return rtn; 
		}